

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_tcp_socket.c
# Opt level: O0

amqp_socket_t * amqp_tcp_socket_new(amqp_connection_state_t state)

{
  amqp_connection_state_t in_RDI;
  amqp_tcp_socket_t *self;
  amqp_socket_t *local_8;
  
  local_8 = (amqp_socket_t *)calloc(1,0x18);
  if (local_8 == (amqp_socket_t *)0x0) {
    local_8 = (amqp_socket_t *)0x0;
  }
  else {
    local_8->klass = &amqp_tcp_socket_class;
    *(undefined4 *)&local_8[1].klass = 0xffffffff;
    amqp_set_socket(in_RDI,local_8);
  }
  return local_8;
}

Assistant:

amqp_socket_t *amqp_tcp_socket_new(amqp_connection_state_t state) {
  struct amqp_tcp_socket_t *self = calloc(1, sizeof(*self));
  if (!self) {
    return NULL;
  }
  self->klass = &amqp_tcp_socket_class;
  self->sockfd = -1;

  amqp_set_socket(state, (amqp_socket_t *)self);

  return (amqp_socket_t *)self;
}